

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSampleWrapC.cpp
# Opt level: O0

void tsgDreamSample(int form,int num_burnup,int num_collect,tsg_dream_pdf distribution,
                   void *state_pntr,void *domain_grid,double *domain_lower,double *dommain_upper,
                   tsg_dream_domain domain_callback,char *iupdate_type,double iupdate_magnitude,
                   tsg_dream_iupdate iupdate_callback,int dupdate_percent,
                   tsg_dream_dupdate dupdate_callback,char *random_type,int random_seed,
                   tsg_dream_random random_callback,int *err)

{
  char *__s;
  int iVar1;
  int iVar2;
  TypeDistribution TVar3;
  TypeSamplingForm TVar4;
  time_t tVar5;
  uint local_408;
  result_type_conflict local_400;
  runtime_error *anon_var_7;
  function<double_()> local_3b8;
  function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> local_398;
  anon_class_16_2_bcd38977 local_378;
  DreamPDF local_368;
  function<double_()> local_348;
  function<double_()> local_328;
  function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> local_308;
  anon_class_16_2_bcd38977 local_2e8;
  DreamPDF local_2d8;
  function<double_()> local_2b8;
  function<double_()> local_298;
  anon_class_8_1_75ba41f0 local_278;
  function<void_(std::vector<double,_std::allocator<double>_>_&)> local_270;
  function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> local_250;
  anon_class_16_2_bcd38977 local_230;
  DreamPDF local_220;
  function<double_()> local_200;
  function<double_()> local_1e0;
  anon_class_8_1_75ba41f0 local_1c0;
  function<void_(std::vector<double,_std::allocator<double>_>_&)> local_1b8;
  function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> local_198;
  anon_class_16_2_bcd38977 local_178;
  DreamPDF local_168;
  anon_class_32_4_11f9070c local_148;
  undefined1 local_128 [8];
  function<double_()> randgen;
  undefined1 local_100 [8];
  string rtype;
  uniform_real_distribution<double> unif;
  minstd_rand park_miller;
  function<double_()> diff_update;
  allocator<char> local_91;
  string local_90;
  TypeDistribution local_6c;
  undefined1 local_68 [4];
  TypeDistribution dist;
  function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> domain;
  int num_dimensions;
  TasmanianDREAM *state;
  double iupdate_magnitude_local;
  void *domain_grid_local;
  void *state_pntr_local;
  tsg_dream_pdf distribution_local;
  int local_10;
  int num_collect_local;
  int num_burnup_local;
  int form_local;
  
  *err = 1;
  state_pntr_local = distribution;
  distribution_local._4_4_ = num_collect;
  local_10 = num_burnup;
  num_collect_local = form;
  domain._M_invoker._4_4_ = TasDREAM::TasmanianDREAM::getNumDimensions((TasmanianDREAM *)state_pntr)
  ;
  TasDREAM::getSpecifiedDomain
            ((function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> *)local_68,
             domain._M_invoker._4_4_,domain_grid,domain_lower,dommain_upper,domain_callback);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,iupdate_type,&local_91);
  TVar3 = TasDREAM::IO::getDistributionString(&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  local_6c = TVar3;
  TasDREAM::getSpecifiedDifferentialUpdate
            ((function<double_()> *)&park_miller,dupdate_percent,dupdate_callback);
  if (random_seed == -1) {
    local_400 = time((time_t *)0x0);
  }
  else {
    local_400 = (result_type_conflict)random_seed;
  }
  std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
             &unif._M_param._M_b,local_400);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)((long)&rtype.field_2 + 8),0.0,1.0);
  if (random_seed == -1) {
    tVar5 = time((time_t *)0x0);
    local_408 = (uint)tVar5;
  }
  else {
    local_408 = random_seed;
  }
  srand(local_408);
  __s = random_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_100,__s,(allocator<char> *)((long)&randgen._M_invoker + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&randgen._M_invoker + 7));
  local_148.rtype = (string *)local_100;
  local_148.unif = (uniform_real_distribution<double> *)((long)&rtype.field_2 + 8);
  local_148.park_miller = (minstd_rand *)&unif._M_param._M_b;
  local_148.random_callback = &random_callback;
  tsgDreamSample::anon_class_32_4_11f9070c::operator()((function<double_()> *)local_128,&local_148);
  if (local_6c == dist_null) {
    TVar4 = TasDREAM::IO::intToForm(num_collect_local);
    iVar2 = local_10;
    iVar1 = distribution_local._4_4_;
    if (TVar4 == regform) {
      local_178.num_dimensions = (int *)((long)&domain._M_invoker + 4);
      local_178.distribution = (tsg_dream_pdf *)&state_pntr_local;
      std::
      function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
      ::function<tsgDreamSample::__1,void>
                ((function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
                  *)&local_168,&local_178);
      std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::function
                (&local_198,
                 (function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> *)local_68);
      local_1c0.iupdate_callback = &iupdate_callback;
      std::function<void(std::vector<double,std::allocator<double>>&)>::
      function<tsgDreamSample::__2,void>
                ((function<void(std::vector<double,std::allocator<double>>&)> *)&local_1b8,
                 &local_1c0);
      std::function<double_()>::function(&local_1e0,(function<double_()> *)&park_miller);
      std::function<double_()>::function(&local_200,(function<double_()> *)local_128);
      TasDREAM::SampleDREAM<(TasDREAM::TypeSamplingForm)0>
                (iVar2,iVar1,&local_168,&local_198,(TasmanianDREAM *)state_pntr,&local_1b8,
                 &local_1e0,&local_200);
      std::function<double_()>::~function(&local_200);
      std::function<double_()>::~function(&local_1e0);
      std::function<void_(std::vector<double,_std::allocator<double>_>_&)>::~function(&local_1b8);
      std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::~function
                (&local_198);
      std::
      function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
      ::~function(&local_168);
    }
    else {
      local_230.num_dimensions = (int *)((long)&domain._M_invoker + 4);
      local_230.distribution = (tsg_dream_pdf *)&state_pntr_local;
      std::
      function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
      ::function<tsgDreamSample::__3,void>
                ((function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
                  *)&local_220,&local_230);
      std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::function
                (&local_250,
                 (function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> *)local_68);
      local_278.iupdate_callback = &iupdate_callback;
      std::function<void(std::vector<double,std::allocator<double>>&)>::
      function<tsgDreamSample::__4,void>
                ((function<void(std::vector<double,std::allocator<double>>&)> *)&local_270,
                 &local_278);
      std::function<double_()>::function(&local_298,(function<double_()> *)&park_miller);
      std::function<double_()>::function(&local_2b8,(function<double_()> *)local_128);
      TasDREAM::SampleDREAM<(TasDREAM::TypeSamplingForm)1>
                (iVar2,iVar1,&local_220,&local_250,(TasmanianDREAM *)state_pntr,&local_270,
                 &local_298,&local_2b8);
      std::function<double_()>::~function(&local_2b8);
      std::function<double_()>::~function(&local_298);
      std::function<void_(std::vector<double,_std::allocator<double>_>_&)>::~function(&local_270);
      std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::~function
                (&local_250);
      std::
      function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
      ::~function(&local_220);
    }
  }
  else {
    TVar4 = TasDREAM::IO::intToForm(num_collect_local);
    iVar2 = local_10;
    iVar1 = distribution_local._4_4_;
    if (TVar4 == regform) {
      local_2e8.num_dimensions = (int *)((long)&domain._M_invoker + 4);
      local_2e8.distribution = (tsg_dream_pdf *)&state_pntr_local;
      std::
      function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
      ::function<tsgDreamSample::__5,void>
                ((function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
                  *)&local_2d8,&local_2e8);
      std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::function
                (&local_308,
                 (function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> *)local_68);
      TVar3 = local_6c;
      std::function<double_()>::function(&local_328,(function<double_()> *)&park_miller);
      std::function<double_()>::function(&local_348,(function<double_()> *)local_128);
      TasDREAM::SampleDREAM<(TasDREAM::TypeSamplingForm)0>
                (iVar2,iVar1,&local_2d8,&local_308,(TasmanianDREAM *)state_pntr,TVar3,
                 iupdate_magnitude,&local_328,&local_348);
      std::function<double_()>::~function(&local_348);
      std::function<double_()>::~function(&local_328);
      std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::~function
                (&local_308);
      std::
      function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
      ::~function(&local_2d8);
    }
    else {
      local_378.num_dimensions = (int *)((long)&domain._M_invoker + 4);
      local_378.distribution = (tsg_dream_pdf *)&state_pntr_local;
      std::
      function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
      ::function<tsgDreamSample::__6,void>
                ((function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
                  *)&local_368,&local_378);
      std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::function
                (&local_398,
                 (function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> *)local_68);
      TVar3 = local_6c;
      std::function<double_()>::function(&local_3b8,(function<double_()> *)&park_miller);
      std::function<double_()>::function
                ((function<double_()> *)&anon_var_7,(function<double_()> *)local_128);
      TasDREAM::SampleDREAM<(TasDREAM::TypeSamplingForm)1>
                (iVar2,iVar1,&local_368,&local_398,(TasmanianDREAM *)state_pntr,TVar3,
                 iupdate_magnitude,&local_3b8,(function<double_()> *)&anon_var_7);
      std::function<double_()>::~function((function<double_()> *)&anon_var_7);
      std::function<double_()>::~function(&local_3b8);
      std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::~function
                (&local_398);
      std::
      function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
      ::~function(&local_368);
    }
  }
  *err = 0;
  std::function<double_()>::~function((function<double_()> *)local_128);
  std::__cxx11::string::~string((string *)local_100);
  std::function<double_()>::~function((function<double_()> *)&park_miller);
  std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::~function
            ((function<bool_(const_std::vector<double,_std::allocator<double>_>_&)> *)local_68);
  return;
}

Assistant:

void tsgDreamSample(int form,
                    int num_burnup, int num_collect,
                    tsg_dream_pdf distribution,
                    void* state_pntr,
                    void *domain_grid, double domain_lower[], double dommain_upper[], tsg_dream_domain domain_callback,
                    const char* iupdate_type, double iupdate_magnitude, tsg_dream_iupdate iupdate_callback,
                    int dupdate_percent, tsg_dream_dupdate dupdate_callback,
                    const char* random_type, int random_seed, tsg_dream_random random_callback, int *err){
    *err = 1;
    TasmanianDREAM& state = *reinterpret_cast<TasmanianDREAM*>(state_pntr);

    int num_dimensions = (int) state.getNumDimensions();

    auto domain = getSpecifiedDomain(num_dimensions, domain_grid, domain_lower, dommain_upper, domain_callback);

    TypeDistribution dist = IO::getDistributionString(iupdate_type);

    auto diff_update = getSpecifiedDifferentialUpdate(dupdate_percent, dupdate_callback);

    std::minstd_rand park_miller((random_seed == -1) ? static_cast<long unsigned>(std::time(nullptr)) : random_seed);
    std::uniform_real_distribution<double> unif(0.0, 1.0);
    srand((unsigned int) ((random_seed == -1) ? static_cast<long unsigned>(std::time(nullptr)) : random_seed));
    std::string rtype(random_type);

    auto randgen = [&]()->
    std::function<double(void)>{
        if (rtype == "default"){
            return [&]()->double{ return tsgCoreUniform01(); };
        }else if (rtype == "minstd_rand"){
            return [&]()->double{ return unif(park_miller); };
        }else{
            return [&]()->double{ return random_callback(); };
        }
    }();

    try{
        if (dist == dist_null){
            if (IO::intToForm(form) == regform){
                SampleDREAM<regform>(num_burnup, num_collect, [&](const std::vector<double> &candidates, std::vector<double> &values)->
                void{
                    int num_samples = (int) candidates.size() / num_dimensions;
                    int error_code = 0;
                    distribution(num_samples, num_dimensions, candidates.data(), values.data(), &error_code);
                    if (error_code != 0) throw std::runtime_error("The Python callback returned an error in tsgDreamSample()");
                }, domain, state, [&](std::vector<double> &x)->
                void{
                    int error_code = 0;
                    iupdate_callback((int) x.size(), x.data(), &error_code);
                    if (error_code != 0) throw std::runtime_error("The Python callback returned an error in tsgDreamSample()");
                }, diff_update, randgen);
            }else{
                SampleDREAM<logform>(num_burnup, num_collect, [&](const std::vector<double> &candidates, std::vector<double> &values)->
                void{
                    int num_samples = (int) candidates.size() / num_dimensions;
                    int error_code = 0;
                    distribution(num_samples, num_dimensions, candidates.data(), values.data(), &error_code);
                    if (error_code != 0) throw std::runtime_error("The Python callback returned an error in tsgDreamSample()");
                }, domain, state, [&](std::vector<double> &x)->
                void{
                    int error_code = 0;
                    iupdate_callback((int) x.size(), x.data(), &error_code);
                    if (error_code != 0) throw std::runtime_error("The Python callback returned an error in tsgDreamSample()");
                }, diff_update, randgen);
            }
        }else{
            if (IO::intToForm(form) == regform){
                SampleDREAM<regform>(num_burnup, num_collect, [&](const std::vector<double> &candidates, std::vector<double> &values)->
                void{
                    int num_samples = (int) candidates.size() / num_dimensions;
                    int error_code = 0;
                    distribution(num_samples, num_dimensions, candidates.data(), values.data(), &error_code);
                    if (error_code != 0) throw std::runtime_error("The Python callback returned an error in tsgDreamSample()");
                }, domain, state, dist, iupdate_magnitude, diff_update, randgen);
            }else{
                SampleDREAM<logform>(num_burnup, num_collect, [&](const std::vector<double> &candidates, std::vector<double> &values)->
                void{
                    int num_samples = (int) candidates.size() / num_dimensions;
                    int error_code = 0;
                    distribution(num_samples, num_dimensions, candidates.data(), values.data(), &error_code);
                    if (error_code != 0) throw std::runtime_error("The Python callback returned an error in analysis()");
                }, domain, state, dist, iupdate_magnitude, diff_update, randgen);
            }
        }
        *err = 0; // success
    }catch(std::runtime_error &){} // *err will remain 1
}